

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

Move * ddSymmSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  uint uVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  uint local_58;
  int zindex;
  int z;
  int isolated;
  int yindex;
  int xindex;
  int R;
  int gybot;
  int gxtop;
  int limitSize;
  int size;
  int y;
  Move *move;
  Move *moves;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  x_00 = table->invperm[x];
  uVar1 = table->subtables[x].next;
  gybot = table->keys - table->isolated;
  yindex = 0;
  moves._0_4_ = xHigh;
  moves._4_4_ = x;
  _xHigh_local = table;
  for (local_58 = xHigh; (int)uVar1 < (int)local_58; local_58 = local_58 + -1) {
    iVar4 = _xHigh_local->invperm[(int)local_58];
    if ((iVar4 == x_00) || (iVar3 = cuddTestInteract(_xHigh_local,x_00,iVar4), iVar3 != 0)) {
      yindex = (_xHigh_local->subtables[(int)local_58].keys -
               (uint)(_xHigh_local->vars[iVar4]->ref == 1)) + yindex;
    }
  }
  limitSize = cuddNextHigh(_xHigh_local,moves._4_4_);
  gxtop = gybot;
  do {
    if ((int)moves < limitSize || gybot <= gxtop - yindex) {
      return move;
    }
    xindex = _xHigh_local->subtables[limitSize].next;
    while (_xHigh_local->subtables[xindex].next != limitSize) {
      xindex = _xHigh_local->subtables[xindex].next;
    }
    iVar4 = cuddSymmCheck(_xHigh_local,moves._4_4_,limitSize);
    if (iVar4 == 0) {
      if ((_xHigh_local->subtables[(int)moves._4_4_].next == moves._4_4_) &&
         (_xHigh_local->subtables[limitSize].next == limitSize)) {
        iVar4 = _xHigh_local->invperm[limitSize];
        iVar3 = cuddTestInteract(_xHigh_local,x_00,iVar4);
        if (iVar3 != 0) {
          yindex = yindex - (_xHigh_local->subtables[limitSize].keys -
                            (uint)(_xHigh_local->vars[iVar4]->ref == 1));
        }
        gxtop = cuddSwapInPlace(_xHigh_local,moves._4_4_,limitSize);
        if ((gxtop == 0) || (pDVar5 = cuddDynamicAllocNode(_xHigh_local), pDVar5 == (DdNode *)0x0))
        goto LAB_00c0b21e;
        pDVar5->index = moves._4_4_;
        pDVar5->ref = limitSize;
        *(int *)((long)&pDVar5->next + 4) = gxtop;
        (pDVar5->type).kids.T = (DdNode *)move;
        if ((double)gybot * _xHigh_local->maxGrowth < (double)gxtop) {
          return (Move *)pDVar5;
        }
        move = (Move *)pDVar5;
        if (gxtop < gybot) {
          gybot = gxtop;
        }
      }
      else {
        local_58 = _xHigh_local->subtables[(int)moves._4_4_].next + 1;
        do {
          iVar4 = _xHigh_local->invperm[(int)local_58];
          if ((iVar4 == x_00) || (iVar3 = cuddTestInteract(_xHigh_local,x_00,iVar4), iVar3 != 0)) {
            yindex = yindex - (_xHigh_local->subtables[(int)local_58].keys -
                              (uint)(_xHigh_local->vars[iVar4]->ref == 1));
          }
          local_58 = local_58 + 1;
        } while ((int)local_58 <= xindex);
        gxtop = ddSymmGroupMove(_xHigh_local,moves._4_4_,limitSize,&move);
        if (gxtop == 0) {
LAB_00c0b21e:
          while (move != (Move *)0x0) {
            pMVar2 = move->next;
            move->y = 0;
            *(DdNode **)&move->flags = _xHigh_local->nextFree;
            _xHigh_local->nextFree = (DdNode *)move;
            move = pMVar2;
          }
          return (Move *)0x1;
        }
        if ((double)gybot * _xHigh_local->maxGrowth < (double)gxtop) {
          return move;
        }
        if (gxtop < gybot) {
          gybot = gxtop;
        }
        local_58 = _xHigh_local->subtables[xindex].next;
        while (local_58 = local_58 + 1, (int)local_58 <= xindex) {
          iVar4 = _xHigh_local->invperm[(int)local_58];
          if ((iVar4 == x_00) || (iVar3 = cuddTestInteract(_xHigh_local,x_00,iVar4), iVar3 != 0)) {
            yindex = (_xHigh_local->subtables[(int)local_58].keys -
                     (uint)(_xHigh_local->vars[iVar4]->ref == 1)) + yindex;
          }
        }
      }
    }
    else {
      uVar1 = _xHigh_local->subtables[(int)moves._4_4_].next;
      _xHigh_local->subtables[(int)moves._4_4_].next = limitSize;
      _xHigh_local->subtables[xindex].next = uVar1;
    }
    moves._4_4_ = xindex;
    limitSize = cuddNextHigh(_xHigh_local,xindex);
  } while( true );
}

Assistant:

static Move *
ddSymmSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move *moves;
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(moves);

ddSymmSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}